

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dbopl.cpp
# Opt level: O0

void OPL::DOSBox::DBOPL::InitTables(void)

{
  double dVar1;
  Bitu blah_1;
  Channel *chan;
  Bitu opNum;
  Bitu chNum;
  Bitu i_7;
  Bitu blah;
  Bitu index;
  Bitu i_6;
  Chip *chip;
  Bit8u val_2;
  int iStack_30;
  Bit8u i_5;
  int val_1;
  int i_4;
  int base;
  int oct;
  int i_3;
  int i_2;
  int i_1;
  double val;
  int s;
  int i;
  
  if ((doneTables & 1) == 0) {
    doneTables = 1;
    for (val._4_4_ = 0; val._4_4_ < 0x180; val._4_4_ = val._4_4_ + 1) {
      dVar1 = pow(2.0,(double)(val._4_4_ * -8 + 0xff) * 0.00390625 + -1.0);
      *(short *)(MulTable + (long)val._4_4_ * 2) = (short)(int)(dVar1 * 65536.0 + 0.5);
    }
    for (i_3 = 0; i_3 < 0x200; i_3 = i_3 + 1) {
      dVar1 = sin(((double)i_3 + 0.5) * 0.006135923151542565);
      (&WaveTable)[i_3 + 0x200] = (short)(int)(dVar1 * 4084.0);
      (&WaveTable)[i_3] = -(&WaveTable)[i_3 + 0x200];
    }
    for (oct = 0; oct < 0x100; oct = oct + 1) {
      dVar1 = pow(2.0,(double)(oct * -8 + 0xff) * 0.00390625 + -1.0);
      (&WaveTable)[oct + 0x700] = (short)(int)(dVar1 * 4085.0 + 0.5);
      (&WaveTable)[0x6ff - oct] = -(&WaveTable)[oct + 0x700];
    }
    for (base = 0; base < 0x100; base = base + 1) {
      (&WaveTable)[base + 0x400] = WaveTable;
      (&WaveTable)[base + 0x500] = WaveTable;
      (&WaveTable)[base + 0x900] = WaveTable;
      (&WaveTable)[base + 0xc00] = WaveTable;
      (&WaveTable)[base + 0xd00] = WaveTable;
      (&WaveTable)[base + 0x800] = (&WaveTable)[base + 0x200];
      (&WaveTable)[base + 0xa00] = (&WaveTable)[base * 2 + 0x200];
      (&WaveTable)[base + 0xb00] = (&WaveTable)[base << 1];
      (&WaveTable)[base + 0xe00] = (&WaveTable)[base * 2 + 0x200];
      (&WaveTable)[base + 0xf00] = (&WaveTable)[base * 2 + 0x200];
    }
    for (i_4 = 0; i_4 < 8; i_4 = i_4 + 1) {
      for (iStack_30 = 0; iStack_30 < 0x10; iStack_30 = iStack_30 + 1) {
        chip._4_4_ = i_4 * 8 - (uint)(byte)KslCreateTable[iStack_30];
        if (chip._4_4_ < 0) {
          chip._4_4_ = 0;
        }
        KslTable[i_4 * 0x10 + iStack_30] = (char)(chip._4_4_ << 2);
      }
    }
    for (chip._3_1_ = 0; chip._3_1_ < 0x1a; chip._3_1_ = chip._3_1_ + 1) {
      TremoloTable[chip._3_1_] = chip._3_1_;
      TremoloTable[(int)(0x33 - (uint)chip._3_1_)] = chip._3_1_;
    }
    for (blah = 0; blah < 0x20; blah = blah + 1) {
      i_7 = blah & 0xf;
      if (i_7 < 9) {
        if (i_7 < 6) {
          i_7 = (i_7 % 3) * 2 + i_7 / 3;
        }
        if (0xf < blah) {
          i_7._0_2_ = (short)i_7 + 9;
        }
        *(short *)(ChanOffsetTable + (ulong)blah * 2) = (short)i_7 * 0xf8 + 0x2b8;
      }
      else {
        *(undefined2 *)(ChanOffsetTable + (ulong)blah * 2) = 0;
      }
    }
    for (opNum = 0; opNum < 0x40; opNum = opNum + 1) {
      if (((opNum & 7) < 6) && ((opNum >> 3 & 3) != 3)) {
        chan._4_4_ = (opNum >> 3) * 3 + (opNum & 7) % 3;
        if (0xb < chan._4_4_) {
          chan._4_4_ = chan._4_4_ + 4;
        }
        *(short *)(OpOffsetTable + (ulong)opNum * 2) =
             *(short *)(ChanOffsetTable + (ulong)chan._4_4_ * 2) + (short)((opNum & 7) / 3) * 0x68;
      }
      else {
        *(undefined2 *)(OpOffsetTable + (ulong)opNum * 2) = 0;
      }
    }
  }
  return;
}

Assistant:

void InitTables( void ) {
	if ( doneTables )
		return;
	doneTables = true;
#if ( DBOPL_WAVE == WAVE_HANDLER ) || ( DBOPL_WAVE == WAVE_TABLELOG )
	//Exponential volume table, same as the real adlib
	for ( int i = 0; i < 256; i++ ) {
		//Save them in reverse
		ExpTable[i] = (int)( 0.5 + ( pow(2.0, ( 255 - i) * ( 1.0 /256 ) )-1) * 1024 );
		ExpTable[i] += 1024; //or remove the -1 oh well :)
		//Preshift to the left once so the final volume can shift to the right
		ExpTable[i] *= 2;
	}
#endif
#if ( DBOPL_WAVE == WAVE_HANDLER )
	//Add 0.5 for the trunc rounding of the integer cast
	//Do a PI sinetable instead of the original 0.5 PI
	for ( int i = 0; i < 512; i++ ) {
		SinTable[i] = (Bit16s)( 0.5 - log10( sin( (i + 0.5) * (M_PI / 512.0) ) ) / log10(2.0)*256 );
	}
#endif
#if ( DBOPL_WAVE == WAVE_TABLEMUL )
	//Multiplication based tables
	for ( int i = 0; i < 384; i++ ) {
		int s = i * 8;
		//TODO maybe keep some of the precision errors of the original table?
		double val = ( 0.5 + ( pow(2.0, -1.0 + ( 255 - s) * ( 1.0 /256 ) )) * ( 1 << MUL_SH ));
		MulTable[i] = (Bit16u)(val);
	}

	//Sine Wave Base
	for ( int i = 0; i < 512; i++ ) {
		WaveTable[ 0x0200 + i ] = (Bit16s)(sin( (i + 0.5) * (M_PI / 512.0) ) * 4084);
		WaveTable[ 0x0000 + i ] = -WaveTable[ 0x200 + i ];
	}
	//Exponential wave
	for ( int i = 0; i < 256; i++ ) {
		WaveTable[ 0x700 + i ] = (Bit16s)( 0.5 + ( pow(2.0, -1.0 + ( 255 - i * 8) * ( 1.0 /256 ) ) ) * 4085 );
		WaveTable[ 0x6ff - i ] = -WaveTable[ 0x700 + i ];
	}
#endif
#if ( DBOPL_WAVE == WAVE_TABLELOG )
	//Sine Wave Base
	for ( int i = 0; i < 512; i++ ) {
		WaveTable[ 0x0200 + i ] = (Bit16s)( 0.5 - log10( sin( (i + 0.5) * (M_PI / 512.0) ) ) / log10(2.0)*256 );
		WaveTable[ 0x0000 + i ] = ((Bit16s)0x8000) | WaveTable[ 0x200 + i];
	}
	//Exponential wave
	for ( int i = 0; i < 256; i++ ) {
		WaveTable[ 0x700 + i ] = i * 8;
		WaveTable[ 0x6ff - i ] = ((Bit16s)0x8000) | i * 8;
	}
#endif

	//	|    |//\\|____|WAV7|//__|/\  |____|/\/\|
	//	|\\//|    |    |WAV7|    |  \/|    |    |
	//	|06  |0126|27  |7   |3   |4   |4 5 |5   |

#if (( DBOPL_WAVE == WAVE_TABLELOG ) || ( DBOPL_WAVE == WAVE_TABLEMUL ))
	for ( int i = 0; i < 256; i++ ) {
		//Fill silence gaps
		WaveTable[ 0x400 + i ] = WaveTable[0];
		WaveTable[ 0x500 + i ] = WaveTable[0];
		WaveTable[ 0x900 + i ] = WaveTable[0];
		WaveTable[ 0xc00 + i ] = WaveTable[0];
		WaveTable[ 0xd00 + i ] = WaveTable[0];
		//Replicate sines in other pieces
		WaveTable[ 0x800 + i ] = WaveTable[ 0x200 + i ];
		//double speed sines
		WaveTable[ 0xa00 + i ] = WaveTable[ 0x200 + i * 2 ];
		WaveTable[ 0xb00 + i ] = WaveTable[ 0x000 + i * 2 ];
		WaveTable[ 0xe00 + i ] = WaveTable[ 0x200 + i * 2 ];
		WaveTable[ 0xf00 + i ] = WaveTable[ 0x200 + i * 2 ];
	}
#endif

	//Create the ksl table
	for ( int oct = 0; oct < 8; oct++ ) {
		int base = oct * 8;
		for ( int i = 0; i < 16; i++ ) {
			int val = base - KslCreateTable[i];
			if ( val < 0 )
				val = 0;
			//*4 for the final range to match attenuation range
			KslTable[ oct * 16 + i ] = val * 4;
		}
	}
	//Create the Tremolo table, just increase and decrease a triangle wave
	for ( Bit8u i = 0; i < TREMOLO_TABLE / 2; i++ ) {
		Bit8u val = i << ENV_EXTRA;
		TremoloTable[i] = val;
		TremoloTable[TREMOLO_TABLE - 1 - i] = val;
	}
	//Create a table with offsets of the channels from the start of the chip
	DBOPL::Chip* chip = 0;
	for ( Bitu i = 0; i < 32; i++ ) {
		Bitu index = i & 0xf;
		if ( index >= 9 ) {
			ChanOffsetTable[i] = 0;
			continue;
		}
		//Make sure the four op channels follow eachother
		if ( index < 6 ) {
			index = (index % 3) * 2 + ( index / 3 );
		}
		//Add back the bits for highest ones
		if ( i >= 16 )
			index += 9;
		Bitu blah = reinterpret_cast<size_t>( &(chip->chan[ index ]) );
		ChanOffsetTable[i] = blah;
	}
	//Same for operators
	for ( Bitu i = 0; i < 64; i++ ) {
		if ( i % 8 >= 6 || ( (i / 8) % 4 == 3 ) ) {
			OpOffsetTable[i] = 0;
			continue;
		}
		Bitu chNum = (i / 8) * 3 + (i % 8) % 3;
		//Make sure we use 16 and up for the 2nd range to match the chanoffset gap
		if ( chNum >= 12 )
			chNum += 16 - 12;
		Bitu opNum = ( i % 8 ) / 3;
		DBOPL::Channel* chan = 0;
		Bitu blah = reinterpret_cast<size_t>( &(chan->op[opNum]) );
		OpOffsetTable[i] = ChanOffsetTable[ chNum ] + blah;
	}
#if 0
	//Stupid checks if table's are correct
	for ( Bitu i = 0; i < 18; i++ ) {
		Bit32u find = (Bit16u)( &(chip->chan[ i ]) );
		for ( Bitu c = 0; c < 32; c++ ) {
			if ( ChanOffsetTable[c] == find ) {
				find = 0;
				break;
			}
		}
		if ( find ) {
			find = find;
		}
	}
	for ( Bitu i = 0; i < 36; i++ ) {
		Bit32u find = (Bit16u)( &(chip->chan[ i / 2 ].op[i % 2]) );
		for ( Bitu c = 0; c < 64; c++ ) {
			if ( OpOffsetTable[c] == find ) {
				find = 0;
				break;
			}
		}
		if ( find ) {
			find = find;
		}
	}
#endif
}